

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

bool __thiscall
flatbuffers::python::PythonGenerator::generateEnums(PythonGenerator *this,string *one_file_code)

{
  IdlNamer *pIVar1;
  pointer ppEVar2;
  EnumDef *enum_def;
  bool bVar3;
  Parser *pPVar4;
  pointer ppEVar5;
  string enumcode;
  ImportMap imports;
  string mod;
  string local_50;
  
  pPVar4 = (this->super_BaseGenerator).parser_;
  ppEVar5 = (pPVar4->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pIVar1 = &this->namer_;
  do {
    ppEVar2 = (pPVar4->enums_).vec.
              super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar5 == ppEVar2) {
LAB_001dd817:
      return ppEVar5 == ppEVar2;
    }
    enum_def = *ppEVar5;
    enumcode._M_dataplus._M_p = (pointer)&enumcode.field_2;
    enumcode._M_string_length = 0;
    enumcode.field_2._M_local_buf[0] = '\0';
    GenEnum(this,enum_def,&enumcode);
    pPVar4 = (this->super_BaseGenerator).parser_;
    if (((pPVar4->opts).generate_object_based_api & enum_def->is_union) != 0) {
      GenUnionCreator(this,enum_def,&enumcode);
      pPVar4 = (this->super_BaseGenerator).parser_;
    }
    if (((pPVar4->opts).one_file == true) && (enumcode._M_string_length != 0)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imports,
                     &enumcode,"\n\n");
      std::__cxx11::string::append((string *)one_file_code);
      std::__cxx11::string::~string((string *)&imports);
    }
    else {
      imports._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      imports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      imports._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &imports._M_t._M_impl.super__Rb_tree_header._M_header;
      imports._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      imports._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           imports._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (*(pIVar1->super_Namer)._vptr_Namer[0xc])(&mod,pIVar1,enum_def,3);
      (*(pIVar1->super_Namer)._vptr_Namer[0xc])(&local_50,pIVar1,enum_def,1);
      bVar3 = SaveType(this,&local_50,(enum_def->super_Definition).defined_namespace,&enumcode,
                       (ImportMap *)&imports._M_t,&mod,false);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&mod);
      std::
      _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&imports._M_t);
      if (!bVar3) {
        std::__cxx11::string::~string((string *)&enumcode);
        goto LAB_001dd817;
      }
    }
    std::__cxx11::string::~string((string *)&enumcode);
    ppEVar5 = ppEVar5 + 1;
    pPVar4 = (this->super_BaseGenerator).parser_;
  } while( true );
}

Assistant:

bool generateEnums(std::string *one_file_code) const {
    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      auto &enum_def = **it;
      std::string enumcode;
      GenEnum(enum_def, &enumcode);
      if (parser_.opts.generate_object_based_api & enum_def.is_union) {
        GenUnionCreator(enum_def, &enumcode);
      }

      if (parser_.opts.one_file && !enumcode.empty()) {
        *one_file_code += enumcode + "\n\n";
      } else {
        ImportMap imports;
        const std::string mod =
            namer_.File(enum_def, SkipFile::SuffixAndExtension);

        if (!SaveType(namer_.File(enum_def, SkipFile::Suffix),
                      *enum_def.defined_namespace, enumcode, imports, mod,
                      false))
          return false;
      }
    }
    return true;
  }